

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMPhysicalUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  char line [128];
  int local_a8;
  short local_a4;
  
  __stream = fopen("/proc/self/status","r");
  pcVar2 = fgets((char *)&local_a8,0x80,__stream);
  lVar3 = 0;
  while (pcVar2 != (char *)0x0) {
    if (local_a4 == 0x3a53 && local_a8 == 0x53526d56) {
      iVar1 = impl::ParseLine((char *)&local_a8);
      lVar3 = lVar3 + (long)iVar1 * 0x400;
    }
    pcVar2 = fgets((char *)&local_a8,0x80,__stream);
  }
  fclose(__stream);
  return lVar3;
}

Assistant:

int64_t npas4::GetRAMPhysicalUsedByCurrentProcess()
{
#ifdef WIN32
	PROCESS_MEMORY_COUNTERS_EX pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), reinterpret_cast<PPROCESS_MEMORY_COUNTERS>(&pmc), sizeof(pmc));
	return static_cast<int64_t>(pmc.WorkingSetSize);
#else
	constexpr int BufferSize{128};
	int64_t result = 0;
	auto file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != nullptr)
	{
		if(strncmp(line, "VmRSS:", 6) == 0)
		{
			result += npas4::impl::ParseLine(line) * Kilobytes2Bytes;
		}
	}

	fclose(file);
	return static_cast<int64_t>(result);
#endif
}